

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O2

string * __thiscall
RealTrafficConnection::GetStatusStr_abi_cxx11_
          (string *__return_storage_ptr__,RealTrafficConnection *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(this->status) {
  case RT_STATUS_NONE:
    __s = "";
    __a = &local_9;
    break;
  case RT_STATUS_STARTING:
    __s = "Waiting for RealTraffic...";
    __a = &local_a;
    break;
  case RT_STATUS_CONNECTED_PASSIVELY:
    __s = "Connected passively";
    __a = &local_b;
    break;
  case RT_STATUS_CONNECTED_TO:
    __s = "Connected, waiting...";
    __a = &local_c;
    break;
  case RT_STATUS_CONNECTED_FULL:
    __s = "Fully connected";
    __a = &local_d;
    break;
  case RT_STATUS_STOPPING:
    __s = "Stopping...";
    __a = &local_e;
    break;
  default:
    __s = "";
    __a = &local_f;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string RealTrafficConnection::GetStatusStr() const
{
    switch (status) {
        case RT_STATUS_NONE:                return "";
        case RT_STATUS_STARTING:            return "Waiting for RealTraffic...";
        case RT_STATUS_CONNECTED_PASSIVELY: return "Connected passively";
        case RT_STATUS_CONNECTED_TO:        return "Connected, waiting...";
        case RT_STATUS_CONNECTED_FULL:      return "Fully connected";
        case RT_STATUS_STOPPING:            return "Stopping...";
    }
    return "";
}